

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr.c
# Opt level: O2

natwm_error randr_get_screens(natwm_state *state,randr_monitor ***result,size_t *length)

{
  xcb_randr_crtc_t xVar1;
  xcb_rectangle_t xVar2;
  natwm_error nVar3;
  undefined4 uVar4;
  uint uVar5;
  randr_monitor **__ptr;
  randr_monitor **pprVar6;
  long lVar7;
  void *__ptr_00;
  void *__ptr_01;
  randr_monitor *prVar8;
  ulong uVar9;
  int j;
  ulong uVar10;
  void *local_38;
  xcb_generic_error_t *err;
  
  local_38 = (void *)0x0;
  uVar4 = xcb_randr_get_screen_resources(state->xcb,state->screen->root);
  __ptr = (randr_monitor **)xcb_randr_get_screen_resources_reply(state->xcb,uVar4,&local_38);
  if ((local_38 == (void *)0x0) && (__ptr != (randr_monitor **)0x0)) {
    uVar5 = xcb_randr_get_screen_resources_outputs_length(__ptr);
    if ((int)uVar5 < 1) {
      __assert_fail("screen_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/randr.c"
                    ,0x2f,
                    "enum natwm_error randr_get_screens(const struct natwm_state *, struct randr_monitor ***, size_t *)"
                   );
    }
    uVar10 = (ulong)uVar5;
    pprVar6 = (randr_monitor **)calloc(uVar10,8);
    if (pprVar6 == (randr_monitor **)0x0) {
LAB_00108706:
      free(__ptr);
      nVar3 = MEMORY_ALLOCATION_ERROR;
    }
    else {
      lVar7 = xcb_randr_get_screen_resources_outputs(__ptr);
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        uVar4 = xcb_randr_get_output_info(state->xcb,*(undefined4 *)(lVar7 + uVar9 * 4),0);
        __ptr_00 = (void *)xcb_randr_get_output_info_reply(state->xcb,uVar4,&local_38);
        if ((local_38 == (void *)0x0) || (__ptr_00 != (void *)0x0)) {
          uVar4 = xcb_randr_get_crtc_info(state->xcb,*(undefined4 *)((long)__ptr_00 + 0xc),0);
          __ptr_01 = (void *)xcb_randr_get_crtc_info_reply(state->xcb,uVar4,&local_38);
          if ((local_38 != (void *)0x0) && (__ptr_01 == (void *)0x0)) {
            free(__ptr_00);
            free(local_38);
            goto LAB_00108686;
          }
          xVar2 = *(xcb_rectangle_t *)((long)__ptr_01 + 0xc);
          xVar1 = *(xcb_randr_crtc_t *)((long)__ptr_00 + 0xc);
          prVar8 = (randr_monitor *)malloc(0xc);
          if (prVar8 != (randr_monitor *)0x0) {
            prVar8->id = xVar1;
            prVar8->rect = xVar2;
            pprVar6[uVar9] = prVar8;
            free(__ptr_01);
            free(__ptr_00);
            goto LAB_00108686;
          }
          for (uVar10 = 0; __ptr = pprVar6, uVar9 != uVar10; uVar10 = uVar10 + 1) {
            free(pprVar6[uVar10]);
          }
          goto LAB_00108706;
        }
        internal_logger(natwm_logger,LEVEL_WARNING,"Failed to get info for a RANDR screen.");
        free(local_38);
LAB_00108686:
      }
      xcb_randr_select_input(state->xcb,state->screen->root,1);
      *result = pprVar6;
      *length = uVar10;
      free(__ptr);
      nVar3 = NO_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to get RANDR screens");
    free(__ptr);
    nVar3 = GENERIC_ERROR;
  }
  return nVar3;
}

Assistant:

enum natwm_error randr_get_screens(const struct natwm_state *state, struct randr_monitor ***result,
                                   size_t *length)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_randr_get_screen_resources_cookie_t resources_cookie
                = xcb_randr_get_screen_resources(state->xcb, state->screen->root);
        xcb_randr_get_screen_resources_reply_t *resources_reply
                = xcb_randr_get_screen_resources_reply(state->xcb, resources_cookie, &err);

        if (err != XCB_NONE || resources_reply == NULL) {
                LOG_ERROR(natwm_logger, "Failed to get RANDR screens");

                if (resources_reply != NULL) {
                        free(resources_reply);
                }

                return GENERIC_ERROR;
        }

        int screen_count = xcb_randr_get_screen_resources_outputs_length(resources_reply);

        assert(screen_count > 0);

        struct randr_monitor **monitors
                = calloc((size_t)screen_count, sizeof(struct randr_monitor *));

        if (monitors == NULL) {
                free(resources_reply);

                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_randr_output_t *outputs = xcb_randr_get_screen_resources_outputs(resources_reply);

        for (int i = 0; i < screen_count; ++i) {
                xcb_randr_get_output_info_cookie_t cookie
                        = xcb_randr_get_output_info(state->xcb, outputs[i], XCB_CURRENT_TIME);
                xcb_randr_get_output_info_reply_t *output_info_reply
                        = xcb_randr_get_output_info_reply(state->xcb, cookie, &err);

                if (err != XCB_NONE && output_info_reply == NULL) {
                        LOG_WARNING(natwm_logger, "Failed to get info for a RANDR screen.");

                        free(err);

                        continue;
                }

                xcb_randr_get_crtc_info_cookie_t crtc_info_cookie = xcb_randr_get_crtc_info(
                        state->xcb, output_info_reply->crtc, XCB_CURRENT_TIME);
                xcb_randr_get_crtc_info_reply_t *crtc_info_reply
                        = xcb_randr_get_crtc_info_reply(state->xcb, crtc_info_cookie, &err);

                if (err != XCB_NONE && crtc_info_reply == NULL) {
                        // We encounter this when we find an inactive RANDR
                        // screens
                        free(output_info_reply);
                        free(err);

                        continue;
                }

                xcb_rectangle_t screen_rect = {
                        .x = crtc_info_reply->x,
                        .y = crtc_info_reply->y,
                        .width = crtc_info_reply->width,
                        .height = crtc_info_reply->height,
                };

                struct randr_monitor *monitor
                        = randr_monitor_create(output_info_reply->crtc, screen_rect);

                if (monitor == NULL) {
                        // Mem error, need to free existing monitors
                        for (int j = 0; j < i; ++j) {
                                if (monitors[j] != NULL) {
                                        randr_monitor_destroy(monitors[j]);
                                }
                        }

                        free(monitors);

                        return MEMORY_ALLOCATION_ERROR;
                }

                monitors[i] = monitor;

                free(crtc_info_reply);
                free(output_info_reply);
        }

        // Listen for events
        xcb_randr_select_input(
                state->xcb, state->screen->root, XCB_RANDR_NOTIFY_MASK_SCREEN_CHANGE);

        *result = monitors;
        *length = (size_t)screen_count;

        free(resources_reply);

        return NO_ERROR;
}